

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O2

object get_int16_data(SRUP_MSG_DATA *self)

{
  int16_t *piVar1;
  PyObject *pPVar2;
  SRUP_MSG_DATA *in_RSI;
  
  piVar1 = SRUP_MSG_DATA::data_int16(in_RSI);
  if (piVar1 == (int16_t *)0x0) {
    pPVar2 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    pPVar2 = boost::python::api::object_initializer_impl<false,_false>::get<short>(piVar1);
  }
  (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_int16_data(SRUP_MSG_DATA& self)
{
    int16_t* rv;
    rv = self.data_int16();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();

}